

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thrd_sleep.c
# Opt level: O2

int thrd_sleep(timespec *duration,timespec *remaining)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  iVar1 = nanosleep((timespec *)duration,(timespec *)remaining);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *piVar3 == 4 | 0xfffffffe;
  }
  return uVar2;
}

Assistant:

int thrd_sleep( const struct timespec * duration, struct timespec * remaining )
{
    errno = 0;

    if ( nanosleep( duration, remaining ) == 0 )
    {
        return 0;
    }

    if ( errno == EINTR )
    {
        return -1;
    }

    return -2;
}